

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::DefaultFBOMultisampleCase::renderTriangle
          (DefaultFBOMultisampleCase *this,Vec2 *p0,Vec2 *p1,Vec2 *p2,Vec4 *c0,Vec4 *c1,Vec4 *c2)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  VertexArray vao;
  Buffer colBuf;
  Buffer vtxBuf;
  undefined1 local_c8 [8];
  undefined8 local_c0;
  undefined8 local_b0;
  undefined8 local_a0;
  ObjectWrapper local_90;
  ObjectWrapper local_78;
  ObjectWrapper local_60;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  long lVar3;
  
  local_c0 = 0x3f80000000000000;
  local_b0 = 0x3f80000000000000;
  local_a0 = 0x3f80000000000000;
  local_48 = *(undefined8 *)p0->m_data;
  uStack_40 = *(undefined8 *)p0[1].m_data;
  local_38 = *(undefined8 *)p1->m_data;
  uStack_30 = *(undefined8 *)p1[1].m_data;
  local_28 = p2->m_data[0];
  fStack_24 = p2->m_data[1];
  fStack_20 = p2[1].m_data[0];
  fStack_1c = p2[1].m_data[1];
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar4 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_60,(Functions *)CONCAT44(extraout_var_00,iVar1),pOVar4);
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar4 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_78,(Functions *)CONCAT44(extraout_var_01,iVar1),pOVar4);
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar4 = glu::objectTraits(OBJECTTYPE_VERTEX_ARRAY);
  glu::ObjectWrapper::ObjectWrapper(&local_90,(Functions *)CONCAT44(extraout_var_02,iVar1),pOVar4);
  (**(code **)(lVar3 + 0xd8))(local_90.m_object);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"bindVertexArray",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                  ,0x144);
  (**(code **)(lVar3 + 0x40))(0x8892,local_60.m_object);
  (**(code **)(lVar3 + 0x150))(0x8892,0x30,local_c8,0x88e4);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"vtx buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                  ,0x148);
  (**(code **)(lVar3 + 0x610))(this->m_attrPositionLoc);
  (**(code **)(lVar3 + 0x19f0))(this->m_attrPositionLoc,4,0x1406,0,0,0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"vtx vertexAttribPointer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                  ,0x14c);
  (**(code **)(lVar3 + 0x40))(0x8892,local_78.m_object);
  (**(code **)(lVar3 + 0x150))(0x8892,0x30,&local_48,0x88e4);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"col buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                  ,0x150);
  (**(code **)(lVar3 + 0x610))(this->m_attrColorLoc);
  (**(code **)(lVar3 + 0x19f0))(this->m_attrColorLoc,4,0x1406,0,0,0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"col vertexAttribPointer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                  ,0x154);
  (**(code **)(lVar3 + 0x1680))((this->m_program->m_program).m_program);
  (**(code **)(lVar3 + 0x538))(4,0,3);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"drawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                  ,0x158);
  glu::ObjectWrapper::~ObjectWrapper(&local_90);
  glu::ObjectWrapper::~ObjectWrapper(&local_78);
  glu::ObjectWrapper::~ObjectWrapper(&local_60);
  return;
}

Assistant:

void DefaultFBOMultisampleCase::renderTriangle (const Vec2& p0, const Vec2& p1, const Vec2& p2, const Vec4& c0, const Vec4& c1, const Vec4& c2) const
{
	renderTriangle(Vec3(p0.x(), p0.y(), 0.0f),
				   Vec3(p1.x(), p1.y(), 0.0f),
				   Vec3(p2.x(), p2.y(), 0.0f),
				   c0, c1, c2);
}